

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

int getsym_op(void)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  int iVar6;
  long lVar7;
  
  uVar1 = *expr;
  lVar7 = 0;
  ppuVar4 = __ctype_b_loc();
  do {
    bVar2 = *expr;
    iVar6 = (int)lVar7;
    if ((((((*ppuVar4)[(char)bVar2] >> 10 & 1) != 0) ||
         ((bVar2 - 0x2e < 0x32 && ((0x2000000040001U >> ((ulong)(bVar2 - 0x2e) & 0x3f) & 1) != 0))))
        || ((((*ppuVar4)[(char)bVar2] >> 0xb & 1) != 0 && (0 < iVar6)))) ||
       (((bVar3 = true, uVar1 == '@' || (uVar1 == '.')) && ((bVar2 == 0x2d || (bVar2 == 0x2b)))))) {
      if (iVar6 < 0x3f) {
        symbol[(long)iVar6 + 1] = bVar2;
        lVar7 = (long)iVar6 + 1;
      }
      expr = expr + 1;
      bVar3 = false;
    }
    iVar6 = (int)lVar7;
  } while (!bVar3);
  if (iVar6 == 1) {
    pp_Var5 = __ctype_toupper_loc();
    iVar6 = 1;
    if (((*pp_Var5)[symbol[1]] - 0x41U < 0x19) &&
       ((0x1800001U >> ((*pp_Var5)[symbol[1]] - 0x41U & 0x1f) & 1) != 0)) {
      error("Symbol is reserved (A, X or Y)!");
      iVar6 = 0;
    }
  }
  symbol[0] = (char)iVar6;
  symbol[(long)iVar6 + 1] = '\0';
  return iVar6;
}

Assistant:

int
getsym_op(void)
{
	int	valid;
	int	i;
	char c;
	char local_check;

	valid = 1;
	i = 0;

	/* get the symbol, stop to the first 'non symbol' char */
	local_check = *expr;
	while (valid) {
		c = *expr;
		if (isalpha(c) || c == '_' || c == '.' || c == '@' || (isdigit(c) && i >= 1)) {
			if (i < SBOLSZ - 1)
				symbol[++i] = c;
			expr++;
		}
		else if((local_check=='.' || local_check=='@') && ((c=='-') || (c=='+'))) {
                if (i < SBOLSZ - 1)
                    symbol[++i] = c;
                expr++;
             }
            else {
                valid = 0;
            }
	}

	/* is it a reserved symbol? */
	if (i == 1) {
		switch (toupper(symbol[1])) {
		case 'A':
		case 'X':
		case 'Y':
			error("Symbol is reserved (A, X or Y)!");
			i = 0;
		}
	}

	/* store symbol length */
	symbol[0] = i;
	symbol[i+1] = '\0';
	return (i);
}